

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter>::
visit<slang::syntax::FunctionDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter> *this,
          FunctionDeclarationSyntax *t)

{
  char *pcVar1;
  FunctionPortListSyntax *pFVar2;
  int iVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  SyntaxNode *pSVar6;
  vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
  *pvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong hash;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  Token TVar19;
  string_view name;
  string_view name_00;
  try_emplace_args_t local_a9;
  FunctionPortSyntax *local_a8;
  FunctionPortSyntax *local_a0;
  SyntaxNode *local_98;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *local_90;
  undefined1 local_88 [24];
  Info *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  pFVar2 = ((t->prototype).ptr)->portList;
  if (pFVar2 != (FunctionPortListSyntax *)0x0) {
    name._M_str = "argA";
    name._M_len = 4;
    local_a0 = RewriterBase<MultipleRewriter>::makeArg((RewriterBase<MultipleRewriter> *)this,name);
    TVar19 = SyntaxRewriter<MultipleRewriter>::makeComma((SyntaxRewriter<MultipleRewriter> *)this);
    local_a8 = TVar19._0_8_;
    local_90 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                *)(this + 0xb0);
    pSVar6 = &(pFVar2->ports).super_SyntaxListBase.super_SyntaxNode;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pSVar6;
    hash = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar5 = hash >> ((byte)this[0xb0] & 0x3f);
    local_68 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[hash & 0xff];
    uVar12 = (uint)hash & 7;
    uVar9 = 0;
    uVar11 = uVar5;
    do {
      pcVar1 = (char *)(*(long *)(this + 0xc0) + uVar11 * 0x10);
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      bStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      bStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      bStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      bStack_39 = pcVar1[0xf];
      cVar15 = (char)local_68;
      auVar13[0] = -(local_48 == cVar15);
      cVar16 = (char)((uint)local_68 >> 8);
      auVar13[1] = -(cStack_47 == cVar16);
      cVar17 = (char)((uint)local_68 >> 0x10);
      auVar13[2] = -(cStack_46 == cVar17);
      bVar18 = (byte)((uint)local_68 >> 0x18);
      auVar13[3] = -(bStack_45 == bVar18);
      auVar13[4] = -(cStack_44 == cVar15);
      auVar13[5] = -(cStack_43 == cVar16);
      auVar13[6] = -(cStack_42 == cVar17);
      auVar13[7] = -(bStack_41 == bVar18);
      auVar13[8] = -(cStack_40 == cVar15);
      auVar13[9] = -(cStack_3f == cVar16);
      auVar13[10] = -(cStack_3e == cVar17);
      auVar13[0xb] = -(bStack_3d == bVar18);
      auVar13[0xc] = -(cStack_3c == cVar15);
      auVar13[0xd] = -(cStack_3b == cVar16);
      auVar13[0xe] = -(cStack_3a == cVar17);
      auVar13[0xf] = -(bStack_39 == bVar18);
      uVar8 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
      local_98 = pSVar6;
      uStack_64 = local_68;
      uStack_60 = local_68;
      uStack_5c = local_68;
      if (uVar8 != 0) {
        lVar10 = *(long *)(this + 200) + uVar11 * 0x1e0;
        do {
          iVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          if (pSVar6 == (SyntaxNode *)*(undefined1 **)(lVar10 + (ulong)(uint)(iVar3 << 5))) {
            local_88._16_8_ = lVar10 + (ulong)(uint)(iVar3 << 5);
            goto LAB_003c9137;
          }
          uVar8 = uVar8 - 1 & uVar8;
        } while (uVar8 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar12] & bStack_39) == 0) break;
      lVar10 = uVar11 + uVar9;
      uVar9 = uVar9 + 1;
      uVar11 = lVar10 + 1U & *(ulong *)(this + 0xb8);
    } while (uVar9 <= *(ulong *)(this + 0xb8));
    if (*(ulong *)(this + 0xd8) < *(ulong *)(this + 0xd0)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,local_90,uVar5,hash,&local_a9,&local_98);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,local_90,hash,&local_a9,&local_98);
    }
LAB_003c9137:
    pvVar7 = &((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                *)local_88._16_8_)->second;
    local_88._8_8_ = local_a0;
    local_88._16_8_ = local_a8;
    local_88._0_8_ = pSVar6;
    local_70 = TVar19.info;
    std::
    vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
    ::emplace_back<slang::syntax::detail::SyntaxChange>(pvVar7,(SyntaxChange *)local_88);
    name_00._M_str = "argZ";
    name_00._M_len = 4;
    local_a8 = RewriterBase<MultipleRewriter>::makeArg
                         ((RewriterBase<MultipleRewriter> *)this,name_00);
    TVar19 = SyntaxRewriter<MultipleRewriter>::makeComma((SyntaxRewriter<MultipleRewriter> *)this);
    local_a0 = (FunctionPortSyntax *)TVar19.info;
    uVar5 = hash >> ((byte)this[0xe0] & 0x3f);
    local_90 = *(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                 **)(this + 0xe8);
    uVar9 = 0;
    uVar11 = uVar5;
    do {
      pcVar1 = (char *)(*(long *)(this + 0xf0) + uVar11 * 0x10);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      cStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      cStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      cStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      bStack_49 = pcVar1[0xf];
      auVar14[0] = -(local_58 == (char)local_68);
      auVar14[1] = -(cStack_57 == local_68._1_1_);
      auVar14[2] = -(cStack_56 == local_68._2_1_);
      auVar14[3] = -(cStack_55 == local_68._3_1_);
      auVar14[4] = -(cStack_54 == (char)uStack_64);
      auVar14[5] = -(cStack_53 == uStack_64._1_1_);
      auVar14[6] = -(cStack_52 == uStack_64._2_1_);
      auVar14[7] = -(cStack_51 == uStack_64._3_1_);
      auVar14[8] = -(cStack_50 == (char)uStack_60);
      auVar14[9] = -(cStack_4f == uStack_60._1_1_);
      auVar14[10] = -(cStack_4e == uStack_60._2_1_);
      auVar14[0xb] = -(cStack_4d == uStack_60._3_1_);
      auVar14[0xc] = -(cStack_4c == (char)uStack_5c);
      auVar14[0xd] = -(cStack_4b == uStack_5c._1_1_);
      auVar14[0xe] = -(cStack_4a == uStack_5c._2_1_);
      auVar14[0xf] = -(bStack_49 == uStack_5c._3_1_);
      uVar8 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      if (uVar8 != 0) {
        lVar10 = *(long *)(this + 0xf8) + uVar11 * 0x1e0;
        do {
          iVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          if (pSVar6 == (SyntaxNode *)*(undefined1 **)(lVar10 + (ulong)(uint)(iVar3 << 5))) {
            local_88._16_8_ = lVar10 + (ulong)(uint)(iVar3 << 5);
            local_98 = pSVar6;
            goto LAB_003c9274;
          }
          uVar8 = uVar8 - 1 & uVar8;
        } while (uVar8 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar12] & bStack_49) == 0) break;
      lVar10 = uVar11 + uVar9;
      uVar9 = uVar9 + 1;
      uVar11 = lVar10 + 1U & (ulong)local_90;
    } while (uVar9 <= local_90);
    if (*(ulong *)(this + 0x108) < *(ulong *)(this + 0x100)) {
      local_98 = pSVar6;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                  *)(this + 0xe0),uVar5,hash,&local_a9,&local_98);
    }
    else {
      local_98 = pSVar6;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_88,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                  *)(this + 0xe0),hash,&local_a9,&local_98);
    }
LAB_003c9274:
    pvVar7 = &((pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                *)local_88._16_8_)->second;
    local_88._8_8_ = local_a8;
    local_70 = (Info *)local_a0;
    local_88._0_8_ = pSVar6;
    local_88._16_8_ = TVar19._0_8_;
    std::
    vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
    ::emplace_back<slang::syntax::detail::SyntaxChange>(pvVar7,(SyntaxChange *)local_88);
  }
  return;
}

Assistant:

void insertAtBack(const SyntaxListBase& list, SyntaxNode& newNode, Token separator = {}) {
        commits.listInsertAtBack[&list].push_back({&list, &newNode, separator});
    }